

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O2

void __thiscall
GainContainer::update
          (GainContainer *this,Hypergraph *hypergraph,Partitionment *partitionment,Move move)

{
  uint uVar1;
  pointer pCVar2;
  pointer pvVar3;
  uint *puVar4;
  uint *puVar5;
  const_reference cVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer paVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  uint *puVar15;
  ulong uVar16;
  uint local_68;
  uint local_58;
  
  uVar13 = move.cell;
  uVar16 = (ulong)move & 0xffffffff;
  pCVar2 = (this->cell_states_).
           super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)move & 0x100000000;
  uVar8 = uVar7 >> 0x20;
  GainBuckets::delCell
            ((this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
             super__Vector_impl_data._M_start + uVar8,pCVar2[uVar16].gain,
             pCVar2[uVar16].iter._M_node);
  pCVar2[uVar16].locked = true;
  pvVar3 = (hypergraph->cells_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = *(pointer *)
            ((long)&pvVar3[uVar16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  uVar9 = (ulong)move & 0x10000000000;
  uVar10 = uVar9 >> 0x28;
  for (puVar14 = *(uint **)&pvVar3[uVar16].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      puVar14 != puVar4; puVar14 = puVar14 + 1) {
    uVar1 = *puVar14;
    paVar11 = (this->num_cells_in_partitions_).
              super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = paVar11[uVar1]._M_elems[uVar10];
    if (uVar12 == 0) {
      pvVar3 = (hypergraph->nets_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = *(pointer *)
                ((long)&pvVar3[uVar1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (puVar15 = pvVar3[uVar1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar5;
          puVar15 = puVar15 + 1) {
        if (*puVar15 != uVar13) {
          updateGain(this,*puVar15,uVar7 != 0,1);
        }
      }
      paVar11 = (this->num_cells_in_partitions_).
                super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = paVar11[uVar1]._M_elems[uVar10];
    }
    if (uVar12 == 1) {
      pvVar3 = (hypergraph->nets_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = *(pointer *)
                ((long)&pvVar3[uVar1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (puVar15 = pvVar3[uVar1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar5;
          puVar15 = puVar15 + 1) {
        uVar12 = *puVar15;
        if (uVar12 != uVar13) {
          cVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&partitionment->partitionment_,(ulong)uVar12);
          local_68 = (uint)(uVar9 >> 0x28);
          if (local_68 == cVar6) {
            updateGain(this,uVar12,uVar9 != 0,-1);
          }
        }
      }
      paVar11 = (this->num_cells_in_partitions_).
                super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    paVar11[uVar1]._M_elems[uVar8] = paVar11[uVar1]._M_elems[uVar8] - 1;
    paVar11[uVar1]._M_elems[uVar10] = paVar11[uVar1]._M_elems[uVar10] + 1;
    uVar12 = paVar11[uVar1]._M_elems[uVar8];
    if (uVar12 == 0) {
      pvVar3 = (hypergraph->nets_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = *(pointer *)
                ((long)&pvVar3[uVar1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (puVar15 = pvVar3[uVar1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar5;
          puVar15 = puVar15 + 1) {
        if (*puVar15 != uVar13) {
          updateGain(this,*puVar15,uVar9 != 0,-1);
        }
      }
      uVar12 = (this->num_cells_in_partitions_).
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_elems[uVar8];
    }
    if (uVar12 == 1) {
      pvVar3 = (hypergraph->nets_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = *(pointer *)
                ((long)&pvVar3[uVar1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (puVar15 = pvVar3[uVar1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar5;
          puVar15 = puVar15 + 1) {
        uVar1 = *puVar15;
        if (uVar1 != uVar13) {
          cVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&partitionment->partitionment_,(ulong)uVar1);
          local_58 = (uint)(uVar7 >> 0x20);
          if (local_58 == cVar6) {
            updateGain(this,uVar1,uVar7 != 0,1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GainContainer::update(const Hypergraph &hypergraph, const Partitionment &partitionment,
                           Move move) {
  auto &cell_state = cell_states_[move.cell];
  buckets_[move.src].delCell(cell_state.gain, cell_state.iter);
  cell_state.locked = true;
  for (unsigned net : hypergraph.getCells()[move.cell]) {
    // updates before move
    if (num_cells_in_partitions_[net][move.dst] == 0) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell)
          updateGain(cell, move.src, +1);
    }
    if (num_cells_in_partitions_[net][move.dst] == 1) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell && partitionment[cell] == move.dst)
          updateGain(cell, move.dst, -1);
    }
    // move
    --num_cells_in_partitions_[net][move.src];
    ++num_cells_in_partitions_[net][move.dst];
    // updates after move
    if (num_cells_in_partitions_[net][move.src] == 0) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell)
          updateGain(cell, move.dst, -1);
    }
    if (num_cells_in_partitions_[net][move.src] == 1) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell && partitionment[cell] == move.src)
          updateGain(cell, move.src, +1);
    }
  }
}